

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::create(HeapStoreOptimization *this)

{
  unique_ptr<wasm::(anonymous_namespace)::HeapStoreOptimization,_std::default_delete<wasm::(anonymous_namespace)::HeapStoreOptimization>_>
  local_20 [2];
  HeapStoreOptimization *this_local;
  
  this_local = this;
  std::make_unique<wasm::(anonymous_namespace)::HeapStoreOptimization>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::HeapStoreOptimization,std::default_delete<wasm::(anonymous_namespace)::HeapStoreOptimization>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapStoreOptimization,_std::default_delete<wasm::(anonymous_namespace)::HeapStoreOptimization>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<HeapStoreOptimization>();
  }